

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dig.c
# Opt level: O2

void zap_dig(schar dx,schar dy,schar dz)

{
  undefined1 *puVar1;
  byte bVar2;
  char cVar3;
  int iVar4;
  bool bVar5;
  bool bVar6;
  monst *mon;
  level *plVar7;
  boolean bVar8;
  ushort uVar9;
  uint x;
  uint uVar10;
  char *pcVar11;
  obj *obj;
  xchar y;
  char *pcVar12;
  uint y_00;
  permonst *mdat;
  int iVar13;
  xchar x_00;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  char cVar14;
  
  mon = u.ustuck;
  if ((u._1052_1_ & 1) == 0) {
    if (dz == '\0') {
      cVar14 = true;
      if (((level->flags).field_0xa & 2) != 0) {
        bVar8 = on_level(&u.uz,&dungeon_topology.d_earth_level);
        cVar14 = bVar8 != '\0';
      }
      x = (uint)u.ux;
      y_00 = (uint)u.uy;
      uVar10 = mt_random();
      tmp_at(-1,0x40001);
      bVar6 = false;
      bVar5 = false;
      iVar13 = uVar10 % 0x12 + 8;
LAB_00164961:
      iVar4 = iVar13;
      plVar7 = level;
      x = x + (int)dx;
      y_00 = y_00 + (int)dy;
      if (((iVar4 < 1) || (0x4e < x - 1)) || (0x14 < y_00)) goto LAB_00164e45;
      tmp_at(x,y_00);
      (*windowprocs.win_delay)();
      bVar8 = closed_door(level,x,y_00);
      x_00 = (xchar)x;
      y = (xchar)y_00;
      if ((bVar8 == '\0') && (bVar2 = plVar7->locations[x][y_00].typ, bVar2 != 0xf)) {
        iVar13 = iVar4 + -1;
        if (cVar14 == '\0') {
          if ((char)bVar2 < '\r' && bVar2 != 0) {
            if ((plVar7->locations[x][y_00].field_0x6 & 0x80) == 0) {
              pcVar12 = in_rooms(level,x_00,y,0x12);
              if (*pcVar12 != '\0') {
                add_damage(x_00,y,200);
                bVar5 = true;
              }
              plVar7->locations[x][y_00].typ = '\x19';
              goto LAB_00164ab3;
            }
            if (u.uprops[0x1e].intrinsic == 0) {
              if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00164c8d;
              if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00164c88;
LAB_00164d12:
              pcVar12 = "The wall glows then fades.";
              goto LAB_00164d77;
            }
LAB_00164c88:
            if (ublindf != (obj *)0x0) {
LAB_00164c8d:
              if (ublindf->oartifact == '\x1d') goto LAB_00164d12;
            }
LAB_00164cc2:
            iVar13 = 0;
            goto LAB_00164961;
          }
          if ((bVar2 == 0xd) ||
             ((bVar2 == 0 && ((*(uint *)&(level->flags).field_0x8 & 0x100000) != 0)))) {
            if ((plVar7->locations[x][y_00].field_0x6 & 0x80) == 0) {
              plVar7->locations[x][y_00].typ = '\x19';
              goto LAB_00164ab3;
            }
            if (u.uprops[0x1e].intrinsic == 0) {
              if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00164cb8;
              if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00164cb3;
            }
            else {
LAB_00164cb3:
              if (ublindf == (obj *)0x0) goto LAB_00164cc2;
LAB_00164cb8:
              if (ublindf->oartifact != '\x1d') goto LAB_00164cc2;
            }
            pcVar12 = "The tree shudders but is unharmed.";
          }
          else {
            if ((bVar2 & 0xef) != 0) goto LAB_00164961;
            if ((plVar7->locations[x][y_00].field_0x6 & 0x80) == 0) {
              plVar7->locations[x][y_00].typ = '\x18';
LAB_00164ab3:
              unblock_point(x,y_00);
              iVar13 = iVar4 + -3;
              goto LAB_00164961;
            }
            if (u.uprops[0x1e].intrinsic == 0) {
              if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_00164db8;
              if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00164daf;
            }
            else {
LAB_00164daf:
              if (ublindf == (obj *)0x0) goto LAB_00164cc2;
LAB_00164db8:
              if (ublindf->oartifact != '\x1d') goto LAB_00164cc2;
            }
            pcVar12 = "The rock glows then fades.";
          }
LAB_00164d77:
          pline(pcVar12);
          iVar13 = 0;
          goto LAB_00164961;
        }
        if ((char)bVar2 < '\x11') {
          bVar8 = may_dig(level,x_00,y);
          if (bVar8 == '\0') goto LAB_00164e45;
          cVar3 = plVar7->locations[x][y_00].typ;
          if (cVar3 == '\0' || '\f' < cVar3) {
            if (cVar3 == '\r') {
LAB_00164d42:
              plVar7->locations[x][y_00].typ = '\x19';
              goto LAB_00164d87;
            }
            if (cVar3 == '\x0f') goto LAB_00164b3f;
            if ((cVar3 == '\0') && ((*(uint *)&(level->flags).field_0x8 & 0x100000) != 0))
            goto LAB_00164d42;
            plVar7->locations[x][y_00].typ = '\x18';
            iVar13 = -2;
          }
          else {
LAB_00164b3f:
            pcVar12 = in_rooms(level,x_00,y,0x12);
            if (*pcVar12 != '\0') {
              add_damage(x_00,y,200);
              bVar5 = true;
            }
            watch_dig((monst *)0x0,x_00,y,'\x01');
            if ((((level->flags).field_0xa & 8) == 0) || (bVar8 = in_town(x,y_00), bVar8 != '\0')) {
              plVar7->locations[x][y_00].typ = '\x17';
              puVar1 = &plVar7->locations[x][y_00].field_0x6;
              *(uint *)puVar1 = *(uint *)puVar1 & 0xfffffe0f;
            }
            else {
              plVar7->locations[x][y_00].typ = '\x18';
            }
LAB_00164d87:
            iVar13 = -3;
          }
          unblock_point(x,y_00);
          iVar13 = iVar4 + iVar13;
        }
        goto LAB_00164961;
      }
      iVar13 = artifact_door(level,x,y_00);
      if (iVar13 == 0) {
        pcVar12 = in_rooms(level,x_00,y,0x12);
        if (*pcVar12 != '\0') {
          add_damage(x_00,y,400);
          bVar6 = true;
        }
        if (plVar7->locations[x][y_00].typ == '\x0f') {
          plVar7->locations[x][y_00].typ = '\x17';
        }
        else if ((viz_array[y_00][x] & 2U) != 0) {
          pline("The door is razed!");
        }
        watch_dig((monst *)0x0,x_00,y,'\x01');
        puVar1 = &plVar7->locations[x][y_00].field_0x6;
        *(uint *)puVar1 = *(uint *)puVar1 & 0xfffffe0f;
        goto LAB_00164ab3;
      }
      if ((viz_array[y_00][x] & 2U) != 0) {
        pline("The door glows then fades.");
      }
LAB_00164e45:
      tmp_at(-6,0);
      if (bVar5 || bVar6) {
        pcVar12 = "dig into";
        if (bVar6) {
          pcVar12 = "destroy";
        }
        pay_for_damage(pcVar12,'\0');
        return;
      }
    }
    else {
      bVar8 = on_level(&u.uz,&dungeon_topology.d_air_level);
      if (((bVar8 == '\0') &&
          (bVar8 = on_level(&u.uz,&dungeon_topology.d_water_level), bVar8 == '\0')) &&
         ((u._1052_1_ & 2) == 0)) {
        if ((-1 < dz) && (bVar8 = On_stairs(u.ux,u.uy), bVar8 == '\0')) {
          watch_dig((monst *)0x0,u.ux,u.uy,'\x01');
          dighole('\0');
          return;
        }
        bVar8 = On_stairs(u.ux,u.uy);
        if (bVar8 != '\0') {
          if (u.ux == (level->dnladder).sx) {
            pcVar12 = "ladder";
          }
          else {
            pcVar12 = "stairs";
            if (u.ux == (level->upladder).sx) {
              pcVar12 = "ladder";
            }
          }
          pcVar11 = ceiling((int)u.ux,(int)u.uy);
          pline("The beam bounces off the %s and hits the %s.",pcVar12,pcVar11);
        }
        pcVar12 = ceiling((int)u.ux,(int)u.uy);
        pline("You loosen a rock from the %s.",pcVar12);
        pcVar12 = body_part(8);
        pline("It falls on your %s!",pcVar12);
        iVar13 = 6;
        if ((uarmh != (obj *)0x0) &&
           (uVar9 = *(ushort *)&objects[uarmh->otyp].field_0x11 >> 4 & 0x1f, 10 < uVar9)) {
          iVar13 = (uint)(0x11 < uVar9) * 4 + 2;
        }
        iVar13 = rnd(iVar13);
        losehp(iVar13,"falling rock",0);
        obj = mksobj_at(0x213,level,(int)u.ux,(int)u.uy,'\0','\0');
        if (obj != (obj *)0x0) {
          xname(obj);
          stackobj((obj *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
        }
        newsym((int)u.ux,(int)u.uy);
        return;
      }
    }
  }
  else {
    mdat = (u.ustuck)->data;
    if (mdat != mons + 0x9f && mdat->mlet != '\x16') {
      if ((mdat->mflags1 & 0x40000) != 0) {
        pcVar12 = mon_nam(u.ustuck);
        pcVar12 = s_suffix(pcVar12);
        pcVar11 = mbodypart(mon,0x12);
        pline("You pierce %s %s wall!",pcVar12,pcVar11);
        mdat = mon->data;
      }
      if (mdat == mons + 0x13b) {
        iVar13 = (mon->mhp + 1) / 2;
      }
      else {
        iVar13 = 1;
      }
      mon->mhp = iVar13;
      expels(mon,mdat,(mdat->mflags1 >> 0x12 & 1) == 0);
      return;
    }
  }
  return;
}

Assistant:

void zap_dig(schar dx, schar dy, schar dz)
{
	struct rm *room;
	struct monst *mtmp;
	struct obj *otmp;
	int zx, zy, digdepth;
	boolean shopdoor, shopwall, maze_dig;

	if (u.uswallow) {
	    mtmp = u.ustuck;

	    if (!is_whirly(mtmp->data)) {
		if (is_animal(mtmp->data))
		    pline("You pierce %s %s wall!",
			s_suffix(mon_nam(mtmp)), mbodypart(mtmp, STOMACH));

		/* Juiblex takes less damage from a wand of digging. */
		if (mtmp->data == &mons[PM_JUIBLEX])
		    mtmp->mhp = (mtmp->mhp + 1) / 2;
		else
		    mtmp->mhp = 1;		/* almost dead */

		expels(mtmp, mtmp->data, !is_animal(mtmp->data));
	    }
	    return;
	} /* swallowed */

	if (dz) {
	    if (!Is_airlevel(&u.uz) && !Is_waterlevel(&u.uz) && !Underwater) {
		if (dz < 0 || On_stairs(u.ux, u.uy)) {
		    if (On_stairs(u.ux, u.uy))
			pline("The beam bounces off the %s and hits the %s.",
			      (u.ux == level->dnladder.sx || u.ux == level->upladder.sx) ?
			      "ladder" : "stairs", ceiling(u.ux, u.uy));
		    pline("You loosen a rock from the %s.", ceiling(u.ux, u.uy));
		    pline("It falls on your %s!", body_part(HEAD));
		    losehp(rnd((uarmh && is_metallic(uarmh)) ? 2 : 6),
			   "falling rock", KILLED_BY_AN);
		    otmp = mksobj_at(ROCK, level, u.ux, u.uy, FALSE, FALSE);
		    if (otmp) {
			xname(otmp);	/* set dknown, maybe bknown */
			stackobj(otmp);
		    }
		    newsym(u.ux, u.uy);
		} else {
		    watch_dig(NULL, u.ux, u.uy, TRUE);
		    dighole(FALSE);
		}
	    }
	    return;
	} /* up or down */

	/* normal case: digging across the level */
	shopdoor = shopwall = FALSE;
	maze_dig = level->flags.is_maze_lev && !Is_earthlevel(&u.uz);
	zx = u.ux + dx;
	zy = u.uy + dy;
	digdepth = rn1(18, 8);
	tmp_at(DISP_BEAM, dbuf_effect(E_MISC, E_digbeam));
	while (--digdepth >= 0) {
	    if (!isok(zx,zy)) break;
	    room = &level->locations[zx][zy];
	    tmp_at(zx,zy);
	    win_delay_output();	/* wait a little bit */
	    if (closed_door(level, zx, zy) || room->typ == SDOOR) {
		/* ALI - Artifact doors */
		if (artifact_door(level, zx, zy)) {
		    if (cansee(zx, zy))
			pline("The door glows then fades.");
		    break;
		}
		if (*in_rooms(level, zx,zy,SHOPBASE)) {
		    add_damage(zx, zy, 400L);
		    shopdoor = TRUE;
		}
		if (room->typ == SDOOR)
		    room->typ = DOOR;
		else if (cansee(zx, zy))
		    pline("The door is razed!");
		watch_dig(NULL, zx, zy, TRUE);
		room->doormask = D_NODOOR;
		unblock_point(zx,zy); /* vision */
		digdepth -= 2;
	    } else if (maze_dig) {
		if (IS_WALL(room->typ)) {
		    if (!(room->wall_info & W_NONDIGGABLE)) {
			if (*in_rooms(level, zx,zy,SHOPBASE)) {
			    add_damage(zx, zy, 200L);
			    shopwall = TRUE;
			}
			room->typ = ROOM;
			unblock_point(zx,zy); /* vision */
			digdepth -= 2;
		    } else {
			if (!Blind) pline("The wall glows then fades.");
			digdepth = 0;
		    }
		} else if (IS_TREE(level, room->typ)) { /* check trees before stone */
		    if (!(room->wall_info & W_NONDIGGABLE)) {
			room->typ = ROOM;
			unblock_point(zx,zy); /* vision */
			digdepth -= 2;
		    } else {
			if (!Blind) pline("The tree shudders but is unharmed.");
			digdepth = 0;
		    }
		} else if (room->typ == STONE || room->typ == SCORR) {
		    if (!(room->wall_info & W_NONDIGGABLE)) {
			room->typ = CORR;
			unblock_point(zx,zy); /* vision */
			digdepth -= 2;
		    } else {
			if (!Blind) pline("The rock glows then fades.");
			digdepth = 0;
		    }
		}
	    } else if (IS_ROCK(room->typ)) {
		if (!may_dig(level, zx,zy)) break;
		if (IS_WALL(room->typ) || room->typ == SDOOR) {
		    if (*in_rooms(level, zx,zy,SHOPBASE)) {
			add_damage(zx, zy, 200L);
			shopwall = TRUE;
		    }
		    watch_dig(NULL, zx, zy, TRUE);
		    if (level->flags.is_cavernous_lev && !in_town(zx, zy)) {
			room->typ = CORR;
		    } else {
			room->typ = DOOR;
			room->doormask = D_NODOOR;
		    }
		    digdepth -= 2;
		} else if (IS_TREE(level, room->typ)) {
		    room->typ = ROOM;
		    digdepth -= 2;
		} else {	/* IS_ROCK but not IS_WALL or SDOOR */
		    room->typ = CORR;
		    digdepth--;
		}
		unblock_point(zx,zy); /* vision */
	    }
	    zx += dx;
	    zy += dy;
	} /* while */
	
	tmp_at(DISP_END, 0);	/* closing call */
	if (shopdoor || shopwall)
	    pay_for_damage(shopdoor ? "destroy" : "dig into", FALSE);
	return;
}